

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skiplist.hpp
# Opt level: O1

void __thiscall
skiplist<int,_std::less<int>_>::insert(skiplist<int,_std::less<int>_> *this,int value)

{
  pointer *pppSVar1;
  double dVar2;
  int iVar3;
  iterator iVar4;
  iterator iVar5;
  pointer ppSVar6;
  SLNode<int> *pSVar7;
  SLNode<int> *pSVar8;
  SLNode<int> *pSVar9;
  SLNode<int> **ppSVar10;
  _Adaptor<std::mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>,_double>
  __aurng;
  bool bVar11;
  double dVar12;
  vector<SLNode<int>_*,_std::allocator<SLNode<int>_*>_> history;
  SLNode<int> *keyd;
  int local_64;
  SLNode<int> *local_60;
  SLNode<int> *local_58;
  iterator iStack_50;
  SLNode<int> **local_48;
  SLNode<int> *local_38;
  
  this->size_ = this->size_ + 1;
  iVar4._M_current =
       (this->key).super__Vector_base<SLNode<int>_*,_std::allocator<SLNode<int>_*>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_64 = value;
  if ((this->key).super__Vector_base<SLNode<int>_*,_std::allocator<SLNode<int>_*>_>._M_impl.
      super__Vector_impl_data._M_start == iVar4._M_current) {
    pSVar8 = (SLNode<int> *)operator_new(0x48);
    pSVar8->back = (SLNode<int> *)0x0;
    pSVar8->next = (SLNode<int> *)0x0;
    pSVar8->up = (SLNode<int> *)0x0;
    pSVar8->down = (SLNode<int> *)0x0;
    pSVar8->val = value;
    (pSVar8->valz).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    (pSVar8->valz).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    (pSVar8->valz).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    pSVar8->count = 1;
    local_58 = (SLNode<int> *)operator_new(0x48);
    local_58->back = (SLNode<int> *)0x0;
    local_58->next = (SLNode<int> *)0x0;
    local_58->up = (SLNode<int> *)0x0;
    local_58->down = (SLNode<int> *)0x0;
    (local_58->valz).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    (local_58->valz).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    *(undefined8 *)
     ((long)&(local_58->valz).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish + 4) = 0;
    *(undefined8 *)
     ((long)&(local_58->valz).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage + 4) = 0;
    if (iVar4._M_current ==
        (this->key).super__Vector_base<SLNode<int>_*,_std::allocator<SLNode<int>_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<SLNode<int>*,std::allocator<SLNode<int>*>>::_M_realloc_insert<SLNode<int>*const&>
                ((vector<SLNode<int>*,std::allocator<SLNode<int>*>> *)this,iVar4,&local_58);
    }
    else {
      *iVar4._M_current = local_58;
      pppSVar1 = &(this->key).super__Vector_base<SLNode<int>_*,_std::allocator<SLNode<int>_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
      *pppSVar1 = *pppSVar1 + 1;
    }
    ppSVar6 = (this->key).super__Vector_base<SLNode<int>_*,_std::allocator<SLNode<int>_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    (*ppSVar6)->next = pSVar8;
    pSVar8->back = *ppSVar6;
    this->last = pSVar8;
    iVar5._M_current =
         (pSVar8->valz).super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar5._M_current ==
        (pSVar8->valz).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
        ._M_end_of_storage) {
      std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                ((vector<int,std::allocator<int>> *)&pSVar8->valz,iVar5,&local_64);
    }
    else {
      *iVar5._M_current = local_64;
      (pSVar8->valz).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = iVar5._M_current + 1;
    }
    dVar12 = std::
             generate_canonical<double,53ul,std::mersenne_twister_engine<unsigned_long,64ul,312ul,156ul,31ul,13043109905998158313ul,29ul,6148914691236517205ul,17ul,8202884508482404352ul,37ul,18444473444759240704ul,43ul,6364136223846793005ul>>
                       (&this->mt_);
    dVar2 = (this->dist_)._M_param._M_a;
    if (((this->dist_)._M_param._M_b - dVar2) * dVar12 + dVar2 <= 0.5) {
      return;
    }
    do {
      pSVar7 = (SLNode<int> *)operator_new(0x48);
      pSVar7->back = (SLNode<int> *)0x0;
      pSVar7->next = (SLNode<int> *)0x0;
      pSVar7->up = (SLNode<int> *)0x0;
      pSVar7->down = (SLNode<int> *)0x0;
      pSVar7->val = local_64;
      (pSVar7->valz).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      (pSVar7->valz).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      (pSVar7->valz).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      pSVar7->count = 1;
      pSVar8->up = pSVar7;
      pSVar7->down = pSVar8;
      pSVar8 = (SLNode<int> *)operator_new(0x48);
      pSVar8->back = (SLNode<int> *)0x0;
      pSVar8->next = (SLNode<int> *)0x0;
      pSVar8->up = (SLNode<int> *)0x0;
      pSVar8->down = (SLNode<int> *)0x0;
      (pSVar8->valz).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      (pSVar8->valz).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      *(undefined8 *)
       ((long)&(pSVar8->valz).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish + 4) = 0;
      *(undefined8 *)
       ((long)&(pSVar8->valz).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage + 4) = 0;
      local_58->up = pSVar8;
      pSVar8->down = local_58;
      pSVar8->next = pSVar7;
      pSVar7->back = pSVar8;
      iVar4._M_current =
           (this->key).super__Vector_base<SLNode<int>_*,_std::allocator<SLNode<int>_*>_>._M_impl.
           super__Vector_impl_data._M_finish;
      local_58 = pSVar8;
      if (iVar4._M_current ==
          (this->key).super__Vector_base<SLNode<int>_*,_std::allocator<SLNode<int>_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<SLNode<int>*,std::allocator<SLNode<int>*>>::
        _M_realloc_insert<SLNode<int>*const&>
                  ((vector<SLNode<int>*,std::allocator<SLNode<int>*>> *)this,iVar4,&local_58);
      }
      else {
        *iVar4._M_current = pSVar8;
        pppSVar1 = &(this->key).super__Vector_base<SLNode<int>_*,_std::allocator<SLNode<int>_*>_>.
                    _M_impl.super__Vector_impl_data._M_finish;
        *pppSVar1 = *pppSVar1 + 1;
      }
      dVar12 = std::
               generate_canonical<double,53ul,std::mersenne_twister_engine<unsigned_long,64ul,312ul,156ul,31ul,13043109905998158313ul,29ul,6148914691236517205ul,17ul,8202884508482404352ul,37ul,18444473444759240704ul,43ul,6364136223846793005ul>>
                         (&this->mt_);
      dVar2 = (this->dist_)._M_param._M_a;
      pSVar8 = pSVar7;
    } while (0.5 < ((this->dist_)._M_param._M_b - dVar2) * dVar12 + dVar2);
    return;
  }
  local_58 = (SLNode<int> *)0x0;
  iStack_50._M_current = (SLNode<int> **)0x0;
  local_48 = (SLNode<int> **)0x0;
  local_60 = iVar4._M_current[-1];
  if (local_60->down != (SLNode<int> *)0x0) {
    do {
      pSVar8 = local_60->next;
      if (pSVar8 != (SLNode<int> *)0x0) {
        iVar3 = pSVar8->val;
        while ((pSVar7 = pSVar8, iVar3 < local_64 &&
               (pSVar8 = pSVar7->next, local_60 = pSVar7, pSVar8 != (SLNode<int> *)0x0))) {
          iVar3 = pSVar8->val;
        }
      }
      if (iStack_50._M_current == local_48) {
        std::vector<SLNode<int>*,std::allocator<SLNode<int>*>>::
        _M_realloc_insert<SLNode<int>*const&>
                  ((vector<SLNode<int>*,std::allocator<SLNode<int>*>> *)&local_58,iStack_50,
                   &local_60);
      }
      else {
        *iStack_50._M_current = local_60;
        iStack_50._M_current = iStack_50._M_current + 1;
      }
      local_60 = local_60->down;
    } while (local_60->down != (SLNode<int> *)0x0);
  }
  pSVar8 = local_60->next;
  bVar11 = pSVar8 == (SLNode<int> *)0x0;
  if (bVar11) {
LAB_00102792:
    ppSVar10 = &local_60->next;
    pSVar7 = local_60;
  }
  else {
    iVar3 = pSVar8->val;
    pSVar7 = local_60;
    while (local_60 = pSVar8, iVar3 < local_64) {
      pSVar8 = local_60->next;
      bVar11 = pSVar8 == (SLNode<int> *)0x0;
      if (bVar11) goto LAB_00102792;
      iVar3 = pSVar8->val;
      pSVar7 = local_60;
    }
    ppSVar10 = &pSVar7->next;
    if ((!bVar11) && (local_64 == local_60->val)) {
      local_60->count = local_60->count + 1;
      iVar5._M_current =
           (local_60->valz).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar5._M_current ==
          (local_60->valz).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  ((vector<int,std::allocator<int>> *)&local_60->valz,iVar5,&local_64);
      }
      else {
        *iVar5._M_current = local_64;
        (local_60->valz).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar5._M_current + 1;
      }
      goto LAB_0010295c;
    }
  }
  local_60 = pSVar7;
  pSVar8 = local_60;
  pSVar7 = (SLNode<int> *)operator_new(0x48);
  pSVar7->up = (SLNode<int> *)0x0;
  pSVar7->down = (SLNode<int> *)0x0;
  pSVar7->back = (SLNode<int> *)0x0;
  pSVar7->next = (SLNode<int> *)0x0;
  pSVar7->val = local_64;
  (pSVar7->valz).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (pSVar7->valz).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (pSVar7->valz).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  pSVar7->count = 1;
  local_38 = (this->key).super__Vector_base<SLNode<int>_*,_std::allocator<SLNode<int>_*>_>._M_impl.
             super__Vector_impl_data._M_finish[-1];
  pSVar7->next = *ppSVar10;
  pSVar7->back = pSVar8;
  if (*ppSVar10 != (SLNode<int> *)0x0) {
    (*ppSVar10)->back = pSVar7;
  }
  local_60->next = pSVar7;
  if (pSVar7->next == (SLNode<int> *)0x0) {
    this->last = pSVar7;
  }
  iVar5._M_current =
       (pSVar7->valz).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_finish;
  if (iVar5._M_current ==
      (pSVar7->valz).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
              ((vector<int,std::allocator<int>> *)&pSVar7->valz,iVar5,&local_64);
  }
  else {
    *iVar5._M_current = local_64;
    (pSVar7->valz).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = iVar5._M_current + 1;
  }
  while (dVar12 = std::
                  generate_canonical<double,53ul,std::mersenne_twister_engine<unsigned_long,64ul,312ul,156ul,31ul,13043109905998158313ul,29ul,6148914691236517205ul,17ul,8202884508482404352ul,37ul,18444473444759240704ul,43ul,6364136223846793005ul>>
                            (&this->mt_), dVar2 = (this->dist_)._M_param._M_a,
        0.5 < dVar12 * ((this->dist_)._M_param._M_b - dVar2) + dVar2) {
    pSVar8 = (SLNode<int> *)operator_new(0x48);
    pSVar8->up = (SLNode<int> *)0x0;
    pSVar8->down = (SLNode<int> *)0x0;
    pSVar8->back = (SLNode<int> *)0x0;
    pSVar8->next = (SLNode<int> *)0x0;
    pSVar8->val = local_64;
    (pSVar8->valz).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    (pSVar8->valz).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    (pSVar8->valz).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    pSVar8->count = 1;
    pSVar7->up = pSVar8;
    pSVar8->down = pSVar7;
    pSVar7 = pSVar8;
    if (local_58 == (SLNode<int> *)iStack_50._M_current) {
      pSVar9 = (SLNode<int> *)operator_new(0x48);
      pSVar9->up = (SLNode<int> *)0x0;
      pSVar9->down = (SLNode<int> *)0x0;
      pSVar9->back = (SLNode<int> *)0x0;
      pSVar9->next = (SLNode<int> *)0x0;
      (pSVar9->valz).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      (pSVar9->valz).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      *(undefined8 *)
       ((long)&(pSVar9->valz).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish + 4) = 0;
      *(undefined8 *)
       ((long)&(pSVar9->valz).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage + 4) = 0;
      local_38->up = pSVar9;
      pSVar9->down = local_38;
      pSVar9->next = pSVar8;
      pSVar8->back = pSVar9;
      iVar4._M_current =
           (this->key).super__Vector_base<SLNode<int>_*,_std::allocator<SLNode<int>_*>_>._M_impl.
           super__Vector_impl_data._M_finish;
      local_38 = pSVar9;
      if (iVar4._M_current ==
          (this->key).super__Vector_base<SLNode<int>_*,_std::allocator<SLNode<int>_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<SLNode<int>*,std::allocator<SLNode<int>*>>::
        _M_realloc_insert<SLNode<int>*const&>
                  ((vector<SLNode<int>*,std::allocator<SLNode<int>*>> *)this,iVar4,&local_38);
      }
      else {
        *iVar4._M_current = pSVar9;
        pppSVar1 = &(this->key).super__Vector_base<SLNode<int>_*,_std::allocator<SLNode<int>_*>_>.
                    _M_impl.super__Vector_impl_data._M_finish;
        *pppSVar1 = *pppSVar1 + 1;
      }
    }
    else {
      pSVar8->next = *(SLNode<int> **)
                      (*(long *)&((SLNode<int> *)((long)iStack_50._M_current + -0x48))->count + 8);
      pSVar8->back = *(SLNode<int> **)&((SLNode<int> *)((long)iStack_50._M_current + -0x48))->count;
      *(SLNode<int> **)(*(long *)&((SLNode<int> *)((long)iStack_50._M_current + -0x48))->count + 8)
           = pSVar8;
      iStack_50._M_current =
           (SLNode<int> **)&((SLNode<int> *)((long)iStack_50._M_current + -0x48))->count;
    }
  }
LAB_0010295c:
  if (local_58 != (SLNode<int> *)0x0) {
    operator_delete(local_58);
  }
  return;
}

Assistant:

void skiplist<T, X>::insert(T value) {
    ++size_;

    // If entire container empty
    if(key.empty()) {
        SLNode<T> *node = new SLNode<T>(value);
        SLNode<T> *keyd = new SLNode<T>();
        key.push_back(keyd);
        key[0]->next = node;
        node->back = key[0];
        last = node;
        // Put the value into the store
        node->valz.push_back(value);
        // Now insert some more, probabilistically
        while(this->dist_(this->mt_) > 0.5) {
            node->up = new SLNode<T>(value);
            node->up->down = node;
            node = node->up;

            keyd->up = new SLNode<T>();
            keyd->up->down = keyd;
            keyd = keyd->up;

            keyd->next = node;
            node->back = keyd;
            key.push_back(keyd);
        }
        return;
    }
    // Else
    // Find the correct position, insert
    // If not exists, create upper levels for that element

    // This is the prev nodes for all levels
    std::vector<SLNode<T>*> history;
    // Search always starts from the upper left node
    SLNode<T>* follow = key.back();
    // Go on till level 0
    while(follow->down) {
        while(follow->next && compare(follow->next->val,value))
            follow = follow->next;
        history.push_back(follow);
        follow = follow->down;
    }
    // Traverse at level 0 till dest reached
    while(follow->next && compare(follow->next->val,value))
        follow = follow->next;

    // If node already exists, add the new value to the store
    if(follow->next && _420_is_equal(follow->next->val, value, compare)) {
        follow = follow->next;
        follow->count++;
        follow->valz.push_back(value);
        return;
    }

    // Value does not exist. Insert a new node
    SLNode<T> *node = new SLNode<T>(value), *keyd = key.back();
    node->next = follow->next;
    node->back = follow;
    if(follow->next)
        follow->next->back = node;
    follow->next = node;
    if(!node->next)
        last = node;
    // Add into storage
    node->valz.push_back(value);

    // Probabilistically add more levels
    while(this->dist_(this->mt_) > 0.5) {
        node->up = new SLNode<T>(value);
        node->up->down = node;
        node = node->up;
        if(!history.empty()) {
            node->next = history.back()->next;
            node->back = history.back();
            history.back()->next = node;
            history.pop_back();
        }
        else {
            // add directly to the key
            // mess around with the pointers
            keyd->up = new SLNode<T>();
            keyd->up->down = keyd;
            keyd = keyd->up;

            keyd->next = node;
            node->back = keyd;
            key.push_back(keyd);
        }
    }
}